

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::setSelection(Mesh *this,int pickID,Selection *selection)

{
  iterator iVar1;
  mapped_type *ppHVar2;
  int local_1c;
  
  local_1c = pickID;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_CMU462::HalfedgeElement_*>,_std::_Select1st<std::pair<const_int,_CMU462::HalfedgeElement_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
          ::find(&(this->idToElement)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->idToElement)._M_t._M_impl.super__Rb_tree_header) {
    (selection->coordinates).y = 0.0;
    (selection->coordinates).z = 0.0;
    selection->element = (HalfedgeElement *)0x0;
    (selection->coordinates).x = 0.0;
    selection->axis = None;
    selection->object = &this->super_SceneObject;
    ppHVar2 = std::
              map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
              ::operator[](&this->idToElement,&local_1c);
    selection->element = *ppHVar2;
  }
  return;
}

Assistant:

void Mesh::setSelection(int pickID, Selection &selection) {
  // Set the selection to the element specified by the given picking ID;
  // these values were generated in Mesh::draw_pick.
  if (idToElement.find(pickID) != idToElement.end()) {
    selection.clear();
    selection.object = this;
    selection.element = idToElement[pickID];
  }
}